

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O1

bool __thiscall search::BSTree::find(BSTree *this,int key,Record **r)

{
  BSTNode *cur;
  BSTNode *pBVar1;
  
  pBVar1 = this->root_;
  if (pBVar1 == (BSTNode *)0x0) {
    return false;
  }
  do {
    if (pBVar1->key_ == key) goto LAB_00106a74;
    pBVar1 = (&pBVar1->left_)[pBVar1->key_ < key];
  } while (pBVar1 != (BSTNode *)0x0);
  pBVar1 = (BSTNode *)0x0;
LAB_00106a74:
  if (pBVar1 != (BSTNode *)0x0) {
    *r = pBVar1;
  }
  return pBVar1 != (BSTNode *)0x0;
}

Assistant:

bool BSTree::find(int key, Record*& r)
    {
        if (!root_)
            return false;
        auto ret =  root_->search(key);
        if (ret)
        {
            r = ret;
            return true;
        }
        else
            return false;
    }